

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

uint GetFunctionRating(ExpressionContext *ctx,FunctionData *function,TypeFunction *instance,
                      ArrayView<CallArgumentData> arguments)

{
  uint uVar1;
  TypeHandle *pTVar2;
  ScopeData *target;
  ScopeData *type;
  ExprBase *value;
  ScopeData *pSVar3;
  long lVar4;
  TypeClass *type_00;
  bool bVar5;
  bool bVar6;
  ArgumentData *pAVar7;
  CallArgumentData *pCVar8;
  TypeUnsizedArray *lArray;
  uint index;
  TypeClass *lClass;
  TypeArray *rArray;
  IntrusiveList<TypeHandle> *pIVar9;
  uint local_6c;
  TypeClass *rClass;
  ArrayView<CallArgumentData> arguments_local;
  FunctionValue local_48;
  
  arguments_local.data = arguments.data;
  arguments_local.count = arguments.count;
  local_6c = 0xffffffff;
  if ((function->arguments).count == arguments_local.count) {
    index = 0;
    local_6c = 0;
    pIVar9 = &instance->arguments;
    while (pTVar2 = pIVar9->head, pTVar2 != (TypeHandle *)0x0) {
      pAVar7 = SmallArray<ArgumentData,_4U>::operator[](&function->arguments,index);
      target = (ScopeData *)pTVar2->type;
      pCVar8 = ArrayView<CallArgumentData>::operator[](&arguments_local,index);
      type = (ScopeData *)pCVar8->type;
      if (target == type) goto LAB_00155921;
      if (type == (ScopeData *)ctx->typeNullPtr) {
        if (((target != (ScopeData *)0x0) &&
            (uVar1 = *(uint *)&((TypeStruct *)&target->uniqueId)->super_TypeBase, uVar1 < 0x16)) &&
           ((0x340000U >> (uVar1 & 0x1f) & 1) != 0)) goto LAB_00155921;
        if ((target != (ScopeData *)ctx->typeAutoRef) && (target != (ScopeData *)ctx->typeAutoArray)
           ) goto LAB_00155709;
        goto LAB_0015591c;
      }
LAB_00155709:
      if (*(bool *)&((TypeStruct *)((long)&target->startOffset + 4))->super_TypeBase != false)
      goto LAB_00155921;
      uVar1 = *(uint *)&((TypeStruct *)&target->uniqueId)->super_TypeBase;
      if (pAVar7->isExplicit == true) {
        if (uVar1 != 0x15) {
          return 0xffffffff;
        }
LAB_0015572b:
        if (type == (ScopeData *)0x0) {
          return 0xffffffff;
        }
        value = pCVar8->value;
        if (value == (ExprBase *)0x0) {
          return 0xffffffff;
        }
        if ((type->uniqueId != 0x1a) && (type->uniqueId != 0x15)) {
          return 0xffffffff;
        }
        GetFunctionForType(&local_48,ctx,value->source,value,(TypeFunction *)target);
        if (local_48.function == (FunctionData *)0x0) {
          return 0xffffffff;
        }
        goto LAB_00155921;
      }
      if (uVar1 == 0x14) {
        if (type != (ScopeData *)0x0) {
          if ((type->uniqueId == 0x13) &&
             (*(long *)&((SynIdentifier *)((long)&target->functions + 0x18))->super_SynBase ==
              *(long *)((long)&type->types + 0x18))) {
            local_6c = local_6c + 2;
            goto LAB_00155921;
          }
          goto LAB_001557df;
        }
        bVar5 = true;
LAB_001558de:
        if (target == (ScopeData *)ctx->typeAutoRef) {
          if ((!bVar5) && (type->uniqueId == 0x12)) goto LAB_0015591c;
LAB_0015592c:
          local_6c = local_6c + 10;
        }
        else {
          bVar5 = ExpressionContext::IsNumericType(ctx,(TypeBase *)target);
          if ((!bVar5) || (bVar5 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type), !bVar5))
          {
            return 0xffffffff;
          }
          local_6c = local_6c + 1;
        }
      }
      else {
LAB_001557df:
        if (((type == (ScopeData *)0x0) || (target != (ScopeData *)ctx->typeAutoArray)) ||
           (1 < type->uniqueId - 0x13)) {
          if (uVar1 != 0x12) {
            bVar5 = type == (ScopeData *)0x0;
            if ((bVar5) || (uVar1 != 0x18)) {
              if (uVar1 == 0x15) goto LAB_0015572b;
            }
            else if ((type->uniqueId == 0x18) &&
                    (bVar6 = anon_unknown.dwarf_94284::IsDerivedFrom
                                       ((TypeClass *)type,(TypeClass *)target), bVar6))
            goto LAB_0015591c;
            goto LAB_001558de;
          }
          if (type != (ScopeData *)0x0) {
            if (((((type->uniqueId != 0x12) ||
                  (pSVar3 = *(ScopeData **)
                             &((TypeStruct *)((long)&target->types + 0x18))->super_TypeBase,
                  pSVar3 == (ScopeData *)0x0)) || (pSVar3->uniqueId != 0x14)) ||
                ((lVar4 = *(long *)((long)&type->types + 0x18), lVar4 == 0 ||
                 (*(int *)(lVar4 + 8) != 0x13)))) ||
               (*(FunctionData **)((long)&pSVar3->functions + 0x18) !=
                *(FunctionData **)(lVar4 + 0x60))) {
              if (((type->uniqueId == 0x12) &&
                  (pSVar3 = *(ScopeData **)
                             &((TypeStruct *)((long)&target->types + 0x18))->super_TypeBase,
                  pSVar3 != (ScopeData *)0x0)) &&
                 ((pSVar3->uniqueId == 0x18 &&
                  ((type_00 = *(TypeClass **)((long)&type->types + 0x18),
                   type_00 != (TypeClass *)0x0 &&
                   ((type_00->super_TypeStruct).super_TypeBase.typeID == 0x18)))))) {
                bVar5 = anon_unknown.dwarf_94284::IsDerivedFrom(type_00,(TypeClass *)pSVar3);
                if (bVar5) goto LAB_0015591c;
                bVar5 = anon_unknown.dwarf_94284::IsDerivedFrom((TypeClass *)pSVar3,type_00);
                if (bVar5) goto LAB_0015592c;
              }
              goto LAB_0015589b;
            }
            goto LAB_0015592c;
          }
LAB_0015589b:
          bVar5 = type == (ScopeData *)0x0;
          if (*(ScopeData **)&((TypeStruct *)((long)&target->types + 0x18))->super_TypeBase != type)
          goto LAB_001558de;
        }
LAB_0015591c:
        local_6c = local_6c + 5;
      }
LAB_00155921:
      index = index + 1;
      pIVar9 = (IntrusiveList<TypeHandle> *)&pTVar2->next;
    }
  }
  return local_6c;
}

Assistant:

unsigned GetFunctionRating(ExpressionContext &ctx, FunctionData *function, TypeFunction *instance, ArrayView<CallArgumentData> arguments)
{
	if(function->arguments.size() != arguments.size())
		return ~0u;	// Definitely, this isn't the function we are trying to call. Argument count does not match.

	unsigned rating = 0;

	unsigned i = 0;

	for(TypeHandle *argType = instance->arguments.head; argType; argType = argType->next, i++)
	{
		ArgumentData &expectedArgument = function->arguments[i];
		TypeBase *expectedType = argType->type;

		CallArgumentData &actualArgument = arguments[i];
		TypeBase *actualType = actualArgument.type;

		if(expectedType != actualType)
		{
			if(actualType == ctx.typeNullPtr)
			{
				// nullptr is convertable to T ref, T[] and function pointers
				if(isType<TypeRef>(expectedType) || isType<TypeUnsizedArray>(expectedType) || isType<TypeFunction>(expectedType))
					continue;

				// nullptr is also convertable to auto ref and auto[], but it has the same rating as type ref -> auto ref and array -> auto[] defined below
				if(expectedType == ctx.typeAutoRef || expectedType == ctx.typeAutoArray)
				{
					rating += 5;
					continue;
				}
			}

			// Generic function argument
			if(expectedType->isGeneric)
				continue;

			if(expectedArgument.isExplicit)
			{
				if(TypeFunction *target = getType<TypeFunction>(expectedType))
				{
					if(actualArgument.value && (isType<TypeFunction>(actualArgument.type) || isType<TypeFunctionSet>(actualArgument.type)))
					{
						if(FunctionValue functionValue = GetFunctionForType(ctx, actualArgument.value->source, actualArgument.value, target))
							continue;
					}
				}

				return ~0u;
			}

			// array -> class (unsized array)
			if(isType<TypeUnsizedArray>(expectedType) && isType<TypeArray>(actualType))
			{
				TypeUnsizedArray *lArray = getType<TypeUnsizedArray>(expectedType);
				TypeArray *rArray = getType<TypeArray>(actualType);

				if(lArray->subType == rArray->subType)
				{
					rating += 2;
					continue;
				}
			}

			// array -> auto[]
			if(expectedType == ctx.typeAutoArray && (isType<TypeArray>(actualType) || isType<TypeUnsizedArray>(actualType)))
			{
				rating += 5;
				continue;
			}

			// array[N] ref -> array[] -> array[] ref
			if(isType<TypeRef>(expectedType) && isType<TypeRef>(actualType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);
				TypeRef *rRef = getType<TypeRef>(actualType);

				if(isType<TypeUnsizedArray>(lRef->subType) && isType<TypeArray>(rRef->subType))
				{
					TypeUnsizedArray *lArray = getType<TypeUnsizedArray>(lRef->subType);
					TypeArray *rArray = getType<TypeArray>(rRef->subType);

					if(lArray->subType == rArray->subType)
					{
						rating += 10;
						continue;
					}
				}
			}

			// derived ref -> base ref
			// base ref -> derived ref
			if(isType<TypeRef>(expectedType) && isType<TypeRef>(actualType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);
				TypeRef *rRef = getType<TypeRef>(actualType);

				if(isType<TypeClass>(lRef->subType) && isType<TypeClass>(rRef->subType))
				{
					TypeClass *lClass = getType<TypeClass>(lRef->subType);
					TypeClass *rClass = getType<TypeClass>(rRef->subType);

					if(IsDerivedFrom(rClass, lClass))
					{
						rating += 5;
						continue;
					}

					if(IsDerivedFrom(lClass, rClass))
					{
						rating += 10;
						continue;
					}
				}
			}

			if(isType<TypeClass>(expectedType) && isType<TypeClass>(actualType))
			{
				TypeClass *lClass = getType<TypeClass>(expectedType);
				TypeClass *rClass = getType<TypeClass>(actualType);

				if(IsDerivedFrom(rClass, lClass))
				{
					rating += 5;
					continue;
				}
			}

			if(isType<TypeFunction>(expectedType))
			{
				TypeFunction *lFunction = getType<TypeFunction>(expectedType);

				if(actualArgument.value && (isType<TypeFunction>(actualArgument.type) || isType<TypeFunctionSet>(actualArgument.type)))
				{
					if(FunctionValue functionValue = GetFunctionForType(ctx, actualArgument.value->source, actualArgument.value, lFunction))
						continue;
				}
				
				return ~0u;
			}

			// type -> type ref
			if(isType<TypeRef>(expectedType))
			{
				TypeRef *lRef = getType<TypeRef>(expectedType);

				if(lRef->subType == actualType)
				{
					rating += 5;
					continue;
				}
			}

			// type ref -> auto ref
			if(expectedType == ctx.typeAutoRef && isType<TypeRef>(actualType))
			{
				rating += 5;
				continue;
			}

			// type -> type ref -> auto ref
			if(expectedType == ctx.typeAutoRef)
			{
				rating += 10;
				continue;
			}

			// numeric -> numeric
			if(ctx.IsNumericType(expectedType) && ctx.IsNumericType(actualType))
			{
				rating += 1;
				continue;
			}

			return ~0u;
		}
	}

	return rating;
}